

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bread.cpp
# Opt level: O0

void anon_unknown.dwarf_a1f::showHelp(void)

{
  std::operator<<((ostream *)&std::cout,
                  "bread -- convert binary logfiles to human readable text\n\nSynopsis:\n  bread [-f format] [-d date-format] [-s] filename\n\nExamples:\n  bread logfile.blog\n  bread -f \'%S %m (%G:%L)\' logfile.blog\n  zcat logfile.blog.gz | bread -f \'%S %m (%G:%L)\' -\n  tail -c +0 -F logfile.blog | bread\n\nArguments:\n  filename       Path to a logfile. If \'-\' or unspecified, read from stdin\n  format         Arbitrary string with optional placeholders, see \'Event Format\'\n  date-format    Arbitrary string with optional placeholders, see \'Date Format\'\n\nAllowed options:\n  -h             Show this help\n  -f             Set a custom format string to write events, see \'Event Format\'\n  -d             Set a custom format string to write timestamps, see \'Date Format\'\n  -s             Sort events by time\n\nEvent Format\n  Log events are transformed to text by substituting placeholders of the format string by event fields. Available placeholders:\n\n  %I \t Source id\n  %S \t Severity\n  %C \t Category\n  %M \t Function\n  %F \t File, full path\n  %G \t File, file name only\n  %L \t Line\n  %P \t Format string\n  %T \t Argument tags\n  %n \t Writer (thread) name\n  %t \t Writer (thread) id\n  %d \t Timestamp, in producer timezone\n  %u \t Timestamp, in UTC\n  %r \t Timestamp, raw clock value\n  %m \t Message (format string with arguments substituted)\n  %% \t Literal %\n\n  Default format string: \"%S %C [%d] %n %m (%G:%L)\"\n\nDate Format\n  Timestamps are transformed to text by substituting placeholders of the date format string by date components. Available placeholders:\n\n  %Y \t Year, four digits\n  %y \t Year, two digits\n  %m \t Month (01-12)\n  %d \t Day (01-31)\n  %H \t Hour (00-23)\n  %M \t Minute (00-59)\n  %S \t Second (00-59)\n  %N \t Nanosecond (0-999999999)\n  %z \t Offset from UTC in ISO 8601 format (e.g: +0430)\n  %Z \t Time zone name abbreviation\n\n  Default date format string: \"%Y-%m-%d %H:%M:%S.%N\"\n\nReport bugs to:\n  https://github.com/erenon/binlog/issues\n"
                 );
  return;
}

Assistant:

void showHelp()
{
  std::cout <<
    "bread -- convert binary logfiles to human readable text\n"
    "\n"
    "Synopsis:\n"
    "  bread [-f format] [-d date-format] [-s] filename\n"
    "\n"
    "Examples:\n"
    "  bread logfile.blog"                                 "\n"
    "  bread -f '%S %m (%G:%L)' logfile.blog"              "\n"
    "  zcat logfile.blog.gz | bread -f '%S %m (%G:%L)' -"  "\n"
    "  tail -c +0 -F logfile.blog | bread"                 "\n"
    "\n"
    "Arguments:\n"
    "  filename       Path to a logfile. If '-' or unspecified, read from stdin\n"
    "  format         Arbitrary string with optional placeholders, see 'Event Format'\n"
    "  date-format    Arbitrary string with optional placeholders, see 'Date Format'\n"
    "\n"
    "Allowed options:\n"
    "  -h             Show this help\n"
    "  -f             Set a custom format string to write events, see 'Event Format'\n"
    "  -d             Set a custom format string to write timestamps, see 'Date Format'\n"
    "  -s             Sort events by time\n"
    "\n"
    "Event Format\n"
    "  Log events are transformed to text by substituting placeholders"
    " of the format string by event fields. Available placeholders:\n"
    "\n"
    "  %I \t Source id\n"
    "  %S \t Severity\n"
    "  %C \t Category\n"
    "  %M \t Function\n"
    "  %F \t File, full path\n"
    "  %G \t File, file name only\n"
    "  %L \t Line\n"
    "  %P \t Format string\n"
    "  %T \t Argument tags\n"
    "  %n \t Writer (thread) name\n"
    "  %t \t Writer (thread) id\n"
    "  %d \t Timestamp, in producer timezone\n"
    "  %u \t Timestamp, in UTC\n"
    "  %r \t Timestamp, raw clock value\n"
    "  %m \t Message (format string with arguments substituted)\n"
    "  %% \t Literal %\n"
    "\n"
    "  Default format string: \"" BINLOG_DEFAULT_FORMAT "\"\n"
    "\n"
    "Date Format\n"
    "  Timestamps are transformed to text by substituting placeholders"
    " of the date format string by date components. Available placeholders:\n"
    "\n"
    "  %Y \t Year, four digits\n"
    "  %y \t Year, two digits\n"
    "  %m \t Month (01-12)\n"
    "  %d \t Day (01-31)\n"
    "  %H \t Hour (00-23)\n"
    "  %M \t Minute (00-59)\n"
    "  %S \t Second (00-59)\n"
    "  %N \t Nanosecond (0-999999999)\n"
    "  %z \t Offset from UTC in ISO 8601 format (e.g: +0430)\n"
    "  %Z \t Time zone name abbreviation\n"
    "\n"
    "  Default date format string: \"" BINLOG_DEFAULT_DATE_FORMAT "\"\n"
    "\n"
    "Report bugs to:\n"
    "  https://github.com/erenon/binlog/issues\n";
}